

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O2

void __thiscall QGnomeThemePrivate::updateColorScheme(QGnomeThemePrivate *this,QString *themeName)

{
  ColorScheme CVar1;
  bool bVar2;
  ColorScheme CVar3;
  qsizetype qVar4;
  QLatin1StringView s;
  QLatin1StringView s_00;
  
  CVar1 = this->m_colorScheme;
  qVar4 = QtPrivate::lengthHelperPointer<char>("light");
  s.m_data = "light";
  s.m_size = qVar4;
  bVar2 = QString::contains(themeName,s,CaseInsensitive);
  if (bVar2) {
    CVar3 = Light;
  }
  else {
    qVar4 = QtPrivate::lengthHelperPointer<char>("dark");
    s_00.m_data = "dark";
    s_00.m_size = qVar4;
    bVar2 = QString::contains(themeName,s_00,CaseInsensitive);
    CVar3 = (uint)bVar2 * 2;
  }
  this->m_colorScheme = CVar3;
  if (CVar1 == CVar3) {
    return;
  }
  QWindowSystemInterface::handleThemeChange<QWindowSystemInterface::DefaultDelivery>();
  return;
}

Assistant:

void QGnomeThemePrivate::updateColorScheme(const QString &themeName)
{
    const auto oldColorScheme = m_colorScheme;
    if (themeName.contains(QLatin1StringView("light"), Qt::CaseInsensitive)) {
        m_colorScheme = Qt::ColorScheme::Light;
    } else if (themeName.contains(QLatin1StringView("dark"), Qt::CaseInsensitive)) {
        m_colorScheme = Qt::ColorScheme::Dark;
    } else {
        m_colorScheme = Qt::ColorScheme::Unknown;
    }

    if (oldColorScheme != m_colorScheme)
        QWindowSystemInterface::handleThemeChange();
}